

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_assoc.cpp
# Opt level: O3

Assoc * __thiscall
Omega_h::get_box_assoc_abi_cxx11_(Assoc *__return_storage_ptr__,Omega_h *this,int dim)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
  *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
  *pmVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *pvVar5;
  long lVar6;
  int iVar7;
  undefined8 local_50;
  key_type local_48;
  
  lVar6 = 0;
  do {
    lVar3 = (long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_color + lVar6;
    *(undefined4 *)
     ((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color + lVar6) = 0;
    *(undefined8 *)
     ((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent + lVar6) = 0;
    *(long *)((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_left + lVar6) = lVar3;
    *(long *)((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right + lVar6) = lVar3;
    *(undefined8 *)
     ((long)&__return_storage_ptr__->_M_elems[0]._M_t._M_impl.super__Rb_tree_header._M_node_count +
     lVar6) = 0;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0x90);
  iVar7 = (int)this;
  if (iVar7 == 3) {
    local_50 = 0x400000002;
    paVar4 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"z-","");
    pmVar1 = __return_storage_ptr__->_M_elems + 2;
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x400000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"z-","");
    pmVar2 = __return_storage_ptr__->_M_elems + 1;
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xa00000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xa00000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xc00000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xc00000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xd00000003;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"body","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xd00000003;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"body","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xe00000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0xe00000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x1000000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x1000000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x1600000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"z+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x1600000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"z+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
  }
  else if (iVar7 == 2) {
    local_50 = 0x100000001;
    paVar4 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y-","");
    pmVar1 = __return_storage_ptr__->_M_elems + 2;
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x100000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y-","");
    pmVar2 = __return_storage_ptr__->_M_elems + 1;
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x300000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x300000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x400000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"body","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x400000002;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"body","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x500000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x500000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x700000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x700000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"y+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar2,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
  }
  else {
    if (iVar7 != 1) {
      return __return_storage_ptr__;
    }
    local_50 = 0;
    paVar4 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x-","");
    pmVar1 = __return_storage_ptr__->_M_elems + 2;
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x-","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems + 1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x100000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"body","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x100000001;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"body","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x200000000;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pmVar1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_50 = 0x200000000;
    local_48._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x+","");
    pvVar5 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](__return_storage_ptr__->_M_elems + 1,&local_48);
    std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
    _M_assign_aux<Omega_h::ClassPair_const*>(pvVar5,&local_50,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Assoc get_box_assoc(int dim) {
  Assoc assoc;
  if (dim == 1) {
    assoc[NODE_SET]["x-"] = {{0, 0}};
    assoc[SIDE_SET]["x-"] = {{0, 0}};
    assoc[NODE_SET]["body"] = {{1, 1}};
    assoc[ELEM_SET]["body"] = {{1, 1}};
    assoc[NODE_SET]["x+"] = {{0, 2}};
    assoc[SIDE_SET]["x+"] = {{0, 2}};
  } else if (dim == 2) {
    assoc[NODE_SET]["y-"] = {{1, 1}};
    assoc[SIDE_SET]["y-"] = {{1, 1}};
    assoc[NODE_SET]["x-"] = {{1, 3}};
    assoc[SIDE_SET]["x-"] = {{1, 3}};
    assoc[NODE_SET]["body"] = {{2, 4}};
    assoc[ELEM_SET]["body"] = {{2, 4}};
    assoc[NODE_SET]["x+"] = {{1, 5}};
    assoc[SIDE_SET]["x+"] = {{1, 5}};
    assoc[NODE_SET]["y+"] = {{1, 7}};
    assoc[SIDE_SET]["y+"] = {{1, 7}};
  } else if (dim == 3) {
    assoc[NODE_SET]["z-"] = {{2, 4}};
    assoc[SIDE_SET]["z-"] = {{2, 4}};
    assoc[NODE_SET]["y-"] = {{2, 10}};
    assoc[SIDE_SET]["y-"] = {{2, 10}};
    assoc[NODE_SET]["x-"] = {{2, 12}};
    assoc[SIDE_SET]["x-"] = {{2, 12}};
    assoc[NODE_SET]["body"] = {{3, 13}};
    assoc[ELEM_SET]["body"] = {{3, 13}};
    assoc[NODE_SET]["x+"] = {{2, 14}};
    assoc[SIDE_SET]["x+"] = {{2, 14}};
    assoc[NODE_SET]["y+"] = {{2, 16}};
    assoc[SIDE_SET]["y+"] = {{2, 16}};
    assoc[NODE_SET]["z+"] = {{2, 22}};
    assoc[SIDE_SET]["z+"] = {{2, 22}};
  }
  return assoc;
}